

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  uint uVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImPoolIdx IVar7;
  ImGuiTableColumn *pIVar8;
  ImGuiTable *pIVar9;
  float fVar10;
  float fVar11;
  ImGuiTable *in_stack_00000020;
  float decoration_size_1;
  float decoration_size;
  ImGuiTable *in_stack_00000040;
  ImVec2 backup_outer_max_pos;
  float new_width;
  float new_x2;
  ImGuiTableColumn *column_2;
  ImGuiTableColumn *column_1;
  float neighbor_width_to_keep_visible;
  ImGuiTableColumn *column;
  int column_n;
  float width_spacings;
  float max_pos_x;
  float outer_padding_for_border;
  float inner_content_max_y;
  ImGuiWindow *outer_window;
  ImGuiWindow *inner_window;
  ImGuiTableFlags flags;
  ImGuiTable *table;
  ImGuiContext *g;
  ImGuiTable *in_stack_00000110;
  undefined4 in_stack_ffffffffffffff38;
  ImPoolIdx in_stack_ffffffffffffff3c;
  ImDrawList *in_stack_ffffffffffffff40;
  ImPool<ImGuiTable> *this;
  ImGuiTableColumn *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float lhs;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float local_80;
  float fStack_7c;
  ImDrawList *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int i;
  ImVec2 local_44;
  ImVec2 local_3c;
  float local_34;
  
  pIVar5 = GImGui;
  pIVar9 = GImGui->CurrentTable;
  if ((pIVar9->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout((ImGuiTable *)column);
  }
  uVar2 = pIVar9->Flags;
  window = pIVar9->InnerWindow;
  pIVar3 = pIVar9->OuterWindow;
  if ((pIVar9->IsInsideRow & 1U) != 0) {
    TableEndRow(in_stack_00000020);
  }
  if (((((uVar2 & 0x20) != 0) && (pIVar9->HoveredColumnBody != -1)) &&
      (bVar6 = IsAnyItemHovered(), !bVar6)) && (bVar6 = IsMouseReleased(1), bVar6)) {
    TableOpenContextMenu(in_stack_ffffffffffffff54);
  }
  (window->DC).PrevLineSize = pIVar9->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar9->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar9->HostBackupCursorMaxPos;
  fVar11 = pIVar9->RowPosY2;
  if (window == pIVar3) {
    if ((uVar2 & 0x20000) == 0) {
      fVar10 = ImMax<float>((pIVar9->OuterRect).Max.y,fVar11);
      (pIVar9->InnerRect).Max.y = fVar10;
      (pIVar9->OuterRect).Max.y = fVar10;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar11;
  }
  fVar10 = ImMax<float>((pIVar9->WorkRect).Max.y,(pIVar9->OuterRect).Max.y);
  (pIVar9->WorkRect).Max.y = fVar10;
  fVar10 = ImRect::GetHeight(&pIVar9->OuterRect);
  pIVar9->LastOuterHeight = fVar10;
  if ((pIVar9->Flags & 0x1000000U) != 0) {
    in_stack_ffffffffffffff68 = 0;
    fVar10 = 1.0;
    if ((pIVar9->Flags & 0x400U) == 0) {
      fVar10 = 0.0;
    }
    lhs = (pIVar9->InnerWindow->DC).CursorMaxPos.x;
    in_stack_ffffffffffffff6c = fVar10;
    local_34 = lhs;
    if (pIVar9->RightMostEnabledColumn != -1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                         (&pIVar9->Columns,(int)pIVar9->RightMostEnabledColumn);
      local_34 = ImMax<float>(lhs,(pIVar8->WorkMaxX + pIVar9->CellPaddingX + pIVar9->OuterPaddingX)
                                  - fVar10);
      in_stack_ffffffffffffff64 = lhs;
    }
    if (pIVar9->ResizedColumn != -1) {
      local_34 = ImMax<float>(local_34,pIVar9->ResizeLockMinContentsX2);
    }
    (pIVar9->InnerWindow->DC).CursorMaxPos.x = local_34;
  }
  if ((uVar2 & 0x100000) == 0) {
    ImDrawList::PopClipRect(in_stack_ffffffffffffff40);
  }
  ImVector<ImVec4>::back(&window->DrawList->_ClipRectStack);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff40,
                 (ImVec4 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  (window->ClipRect).Min = local_44;
  (window->ClipRect).Max = local_3c;
  if ((uVar2 & 0x780) != 0) {
    TableDrawBorders(in_stack_00000040);
  }
  ImDrawListSplitter::SetCurrentChannel
            ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (ImDrawList *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff54);
  if ((pIVar9->Flags & 0x100000U) == 0) {
    TableMergeDrawChannels(in_stack_00000110);
  }
  ImDrawListSplitter::Merge
            ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  pIVar9->ColumnsAutoFitWidth =
       pIVar9->CellPaddingX * 2.0 * (float)(int)pIVar9->ColumnsEnabledCount +
       pIVar9->OuterPaddingX + pIVar9->OuterPaddingX +
       (pIVar9->CellSpacingX1 + pIVar9->CellSpacingX2) * (float)(pIVar9->ColumnsEnabledCount + -1);
  for (i = 0; i < pIVar9->ColumnsCount; i = i + 1) {
    if ((pIVar9->EnabledMaskByIndex & 1L << ((byte)i & 0x3f)) != 0) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&pIVar9->Columns,i);
      if (((pIVar8->Flags & 8U) == 0) || ((pIVar8->Flags & 0x10U) != 0)) {
        fVar10 = TableGetColumnWidthAuto
                           ((ImGuiTable *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48);
        pIVar9->ColumnsAutoFitWidth = fVar10 + pIVar9->ColumnsAutoFitWidth;
      }
      else {
        pIVar9->ColumnsAutoFitWidth = pIVar8->WidthRequest + pIVar9->ColumnsAutoFitWidth;
      }
    }
  }
  if (((pIVar9->Flags & 0x1000000U) == 0) && (window != pIVar3)) {
    (window->Scroll).x = 0.0;
  }
  else if ((pIVar9->LastResizedColumn != -1) &&
          (((pIVar9->ResizedColumn == -1 && ((window->ScrollbarX & 1U) != 0)) &&
           (pIVar9->InstanceInteracted == pIVar9->InstanceCurrent)))) {
    fVar10 = pIVar9->CellPaddingX + pIVar9->CellPaddingX + pIVar9->MinColumnWidth;
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&pIVar9->Columns,(int)pIVar9->LastResizedColumn);
    if ((pIVar9->InnerClipRect).Min.x <= pIVar8->MaxX) {
      pIVar1 = &(pIVar9->InnerClipRect).Max;
      if (pIVar1->x <= pIVar8->MaxX && pIVar8->MaxX != pIVar1->x) {
        SetScrollFromPosX(window,(pIVar8->MaxX - (window->Pos).x) + fVar10,1.0);
      }
    }
    else {
      SetScrollFromPosX(window,(pIVar8->MaxX - (window->Pos).x) - fVar10,1.0);
    }
  }
  if ((pIVar9->ResizedColumn != -1) && (pIVar9->InstanceCurrent == pIVar9->InstanceInteracted)) {
    pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&pIVar9->Columns,(int)pIVar9->ResizedColumn);
    fVar10 = ImFloor(-pIVar9->CellPaddingX + -pIVar9->CellPaddingX +
                     (((((pIVar5->IO).MousePos.x - (pIVar5->ActiveIdClickOffset).x) + 4.0) -
                      pIVar8->MinX) - pIVar9->CellSpacingX1));
    pIVar9->ResizedColumnNextWidth = fVar10;
  }
  PopID();
  IVar4 = (pIVar3->DC).CursorMaxPos;
  (window->WorkRect).Min = (pIVar9->HostBackupWorkRect).Min;
  (window->WorkRect).Max = (pIVar9->HostBackupWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar9->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = (pIVar9->HostBackupParentWorkRect).Max;
  window->SkipItems = (bool)(pIVar9->HostSkipItems & 1);
  (pIVar3->DC).CursorPos = (pIVar9->OuterRect).Min;
  (pIVar3->DC).ItemWidth = pIVar9->HostBackupItemWidth;
  (pIVar3->DC).ItemWidthStack.Size = pIVar9->HostBackupItemWidthStackSize;
  (pIVar3->DC).ColumnsOffset.x = (pIVar9->HostBackupColumnsOffset).x;
  if (window == pIVar3) {
    ImRect::GetSize((ImRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c);
    ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
            (ImGuiID)in_stack_ffffffffffffff64,
            (ImRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  else {
    EndChild();
  }
  local_80 = IVar4.x;
  if ((pIVar9->Flags & 0x10000U) == 0) {
    if (0.0 < (pIVar9->UserOuterSize).x) {
      fVar10 = ImMax<float>(local_80,(pIVar9->OuterRect).Max.x);
      (pIVar3->DC).CursorMaxPos.x = fVar10;
    }
    else {
      if ((pIVar9->Flags & 0x1000000U) == 0) {
        in_stack_ffffffffffffff74 = 0.0;
      }
      else {
        in_stack_ffffffffffffff74 = (window->ScrollbarSizes).x;
      }
      fVar10 = ImMax<float>((pIVar3->DC).IdealMaxPos.x,
                            ((pIVar9->OuterRect).Min.x + pIVar9->ColumnsAutoFitWidth +
                            in_stack_ffffffffffffff74) - (pIVar9->UserOuterSize).x);
      (pIVar3->DC).IdealMaxPos.x = fVar10;
      fVar10 = ImMin<float>((pIVar9->OuterRect).Max.x,
                            (pIVar9->OuterRect).Min.x + pIVar9->ColumnsAutoFitWidth);
      fVar10 = ImMax<float>(local_80,fVar10);
      (pIVar3->DC).CursorMaxPos.x = fVar10;
    }
  }
  else {
    fVar10 = ImMax<float>(local_80,(pIVar9->OuterRect).Min.x + pIVar9->ColumnsAutoFitWidth);
    (pIVar3->DC).CursorMaxPos.x = fVar10;
  }
  fStack_7c = IVar4.y;
  if (0.0 < (pIVar9->UserOuterSize).y) {
    fVar11 = ImMax<float>(fStack_7c,(pIVar9->OuterRect).Max.y);
    (pIVar3->DC).CursorMaxPos.y = fVar11;
  }
  else {
    if ((pIVar9->Flags & 0x2000000U) == 0) {
      in_stack_ffffffffffffff70 = 0.0;
    }
    else {
      in_stack_ffffffffffffff70 = (window->ScrollbarSizes).y;
    }
    fVar10 = ImMax<float>((pIVar3->DC).IdealMaxPos.y,
                          (fVar11 + in_stack_ffffffffffffff70) - (pIVar9->UserOuterSize).y);
    (pIVar3->DC).IdealMaxPos.y = fVar10;
    fVar11 = ImMin<float>((pIVar9->OuterRect).Max.y,fVar11);
    fVar11 = ImMax<float>(fStack_7c,fVar11);
    (pIVar3->DC).CursorMaxPos.y = fVar11;
  }
  if ((pIVar9->IsSettingsDirty & 1U) != 0) {
    TableSaveSettings((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  pIVar9->IsInitializing = false;
  ImVector<ImGuiPtrOrIndex>::pop_back(&pIVar5->CurrentTableStack);
  if ((pIVar5->CurrentTableStack).Size == 0) {
    pIVar9 = (ImGuiTable *)0x0;
  }
  else {
    this = &pIVar5->Tables;
    ImVector<ImGuiPtrOrIndex>::back(&pIVar5->CurrentTableStack);
    pIVar9 = ImPool<ImGuiTable>::GetByIndex(this,in_stack_ffffffffffffff3c);
  }
  pIVar5->CurrentTable = pIVar9;
  if (pIVar5->CurrentTable == (ImGuiTable *)0x0) {
    IVar7 = -1;
  }
  else {
    IVar7 = ImPool<ImGuiTable>::GetIndex(&pIVar5->Tables,pIVar5->CurrentTable);
  }
  (pIVar3->DC).CurrentTableIdx = IVar7;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = table->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = table->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = table->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    table->DrawSplitter.Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= table->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = table->HostBackupWorkRect;
    inner_window->ParentWorkRect = table->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = table->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = table->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = table->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (table->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - table->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (table->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - table->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    g.CurrentTableStack.pop_back();
    g.CurrentTable = g.CurrentTableStack.Size ? g.Tables.GetByIndex(g.CurrentTableStack.back().Index) : NULL;
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}